

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::AddFuncInfoToFinalizationSet(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ArenaAllocator *pAVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  FuncInfo *local_18;
  FuncInfo *funcInfo_local;
  
  this_00 = this->funcInfosToFinalize;
  local_18 = funcInfo;
  if (this_00 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    this_00 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,this->alloc,0x35916e);
    pAVar1 = this->alloc;
    (this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this_00;
    (this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count
         = 0;
    this_00->allocator = pAVar1;
    this->funcInfosToFinalize = this_00;
  }
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this_00,&local_18);
  return;
}

Assistant:

void ByteCodeGenerator::AddFuncInfoToFinalizationSet(FuncInfo * funcInfo)
{
    if (this->funcInfosToFinalize == nullptr)
    {
        this->funcInfosToFinalize = Anew(alloc, SList<FuncInfo*>, alloc);
    }

    this->funcInfosToFinalize->Prepend(funcInfo);
}